

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManSimulateSeqPref(Gli_Man_t *p,int nPref)

{
  int iVar1;
  uint uVar2;
  Gli_Obj_t *pGVar3;
  uint *puVar4;
  bool bVar5;
  int local_38;
  int local_34;
  int f;
  int i;
  Gli_Obj_t *pObjRo;
  Gli_Obj_t *pObjRi;
  Gli_Obj_t *pObj;
  int nPref_local;
  Gli_Man_t *p_local;
  
  local_34 = 0;
  while( true ) {
    iVar1 = Gli_ManPiNum(p);
    bVar5 = false;
    if (local_34 < iVar1) {
      pObjRi = Gli_ManCi(p,local_34);
      bVar5 = pObjRi != (Gli_Obj_t *)0x0;
    }
    if (!bVar5) break;
    uVar2 = Gli_ManUpdateRandomInput(pObjRi->uSimInfo,0.5);
    pObjRi->uSimInfo = uVar2;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gli_ManRegNum(p);
    bVar5 = false;
    if (local_34 < iVar1) {
      iVar1 = Gli_ManPiNum(p);
      pObjRi = Gli_ManCi(p,iVar1 + local_34);
      bVar5 = pObjRi != (Gli_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pObjRi->uSimInfo = 0;
    local_34 = local_34 + 1;
  }
  for (local_38 = 0; local_38 < nPref; local_38 = local_38 + 1) {
    local_34 = 0;
    while( true ) {
      bVar5 = false;
      if (local_34 < p->nObjData) {
        pObjRi = Gli_ManObj(p,local_34);
        bVar5 = pObjRi != (Gli_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gli_ObjIsTerm(pObjRi);
      if (iVar1 == 0) {
        uVar2 = Gli_ManSimulateSeqNode(p,pObjRi);
        pObjRi->uSimInfo = uVar2;
      }
      iVar1 = Gli_ObjSize(pObjRi);
      local_34 = iVar1 + local_34;
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Gli_ManRegNum(p);
      bVar5 = false;
      if (local_34 < iVar1) {
        iVar1 = Gli_ManPoNum(p);
        pObjRi = Gli_ManCo(p,iVar1 + local_34);
        bVar5 = pObjRi != (Gli_Obj_t *)0x0;
      }
      if (!bVar5) break;
      pGVar3 = Gli_ObjFanin(pObjRi,0);
      pObjRi->uSimInfo = pGVar3->uSimInfo;
      local_34 = local_34 + 1;
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Gli_ManPiNum(p);
      bVar5 = false;
      if (local_34 < iVar1) {
        pObjRi = Gli_ManCi(p,local_34);
        bVar5 = pObjRi != (Gli_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Gli_ManUpdateRandomInput(pObjRi->uSimInfo,0.5);
      pObjRi->uSimInfo = uVar2;
      local_34 = local_34 + 1;
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Gli_ManRegNum(p);
      bVar5 = false;
      if (local_34 < iVar1) {
        iVar1 = Gli_ManPoNum(p);
        pObjRo = Gli_ManCo(p,iVar1 + local_34);
        bVar5 = false;
        if (pObjRo != (Gli_Obj_t *)0x0) {
          iVar1 = Gli_ManPiNum(p);
          _f = Gli_ManCi(p,iVar1 + local_34);
          bVar5 = _f != (Gli_Obj_t *)0x0;
        }
      }
      if (!bVar5) break;
      _f->uSimInfo = pObjRo->uSimInfo;
      local_34 = local_34 + 1;
    }
  }
  if (p->pSimInfoPrev == (uint *)0x0) {
    iVar1 = Gli_ManCiNum(p);
    puVar4 = (uint *)malloc((long)iVar1 << 2);
    p->pSimInfoPrev = puVar4;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (local_34 < iVar1) {
      iVar1 = Vec_IntEntry(p->vCis,local_34);
      pObjRi = Gli_ManObj(p,iVar1);
      bVar5 = pObjRi != (Gli_Obj_t *)0x0;
    }
    if (!bVar5) break;
    p->pSimInfoPrev[local_34] = pObjRi->uSimInfo;
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Gli_ManSimulateSeqPref( Gli_Man_t * p, int nPref )
{
    Gli_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f;
    // initialize simulation data
    Gli_ManForEachPi( p, pObj, i )
        pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
    Gli_ManForEachRo( p, pObj, i )
        pObj->uSimInfo = 0;
    for ( f = 0; f < nPref; f++ )
    {
        // simulate one frame
        Gli_ManForEachNode( p, pObj, i )
            pObj->uSimInfo = Gli_ManSimulateSeqNode( p, pObj );
        Gli_ManForEachRi( p, pObj, i )
            pObj->uSimInfo = Gli_ObjFanin(pObj, 0)->uSimInfo;
        // initialize the next frame
        Gli_ManForEachPi( p, pObj, i )
            pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
        Gli_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRo->uSimInfo = pObjRi->uSimInfo;
    }
    // save simulation data after nPref timeframes
    if ( p->pSimInfoPrev == NULL )
        p->pSimInfoPrev = ABC_ALLOC( unsigned, Gli_ManCiNum(p) );
    Gli_ManForEachCi( p, pObj, i )
        p->pSimInfoPrev[i] = pObj->uSimInfo;
}